

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx_main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  iterator iVar2;
  Tools cmd;
  allocator<char> local_71;
  undefined1 local_70 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  bool local_28;
  
  if (1 < argc) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_70,argv[1],&local_71);
    iVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(int,_char_**)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(int,_char_**)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&builtinCommands_abi_cxx11_._M_h,(key_type *)local_70);
    if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
      operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
    }
    if (iVar2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(int,_char_**)>,_true>
        ._M_cur != (__node_type *)0x0) {
      iVar1 = (**(code **)((long)iVar2.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(int,_char_**)>,_true>
                                 ._M_cur + 0x28))(argc + -1,argv + 1);
      return iVar1;
    }
  }
  local_70._8_8_ = &local_58;
  local_70._16_8_ = 0;
  local_58._M_local_buf[0] = '\0';
  local_48._M_p = (pointer)&local_38;
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_70._0_8_ = &PTR__Command_002608e0;
  local_28 = false;
  iVar1 = ktx::Tools::main((Tools *)local_70,argc,argv);
  ktx::Command::~Command((Command *)local_70);
  return iVar1;
}

Assistant:

int main(int argc, char* argv[]) {
    // If -NSDocumentRevisionsDebugMode YES ever causes any problem it should be discarded here
    // by creating a new argc and argv pair and excluding the problematic arguments from them.
    // This way downstream tools will not have to deal with this issue
    //      // -NSDocumentRevisionsDebugMode YES is appended to the end
    //      // of the command by Xcode when debugging and "Allow debugging when
    //      // using document Versions Browser" is checked in the scheme. It
    //      // defaults to checked and is saved in a user-specific file not the
    //      // pbxproj file, so it can't be disabled in a generated project.
    //      // Remove these from the arguments under consideration.

    InitUTF8CLI(argc, argv);

    if (argc >= 2) {
        // Has a subcommand, attempt to lookup

        const auto it = builtinCommands.find(argv[1]);
        if (it != builtinCommands.end()) {
            // Call built-in subcommand, trimming the first parameter.
            return it->second(argc - 1, argv + 1);
        } else {
            // In the future it is possible to add further logic here to allow loading command plugins
            // from shared libraries or call external commands. There is no defined configuration
            // mechanism to do so, but the command framework has been designed to be able to build
            // subcommands as separate executables or shared libraries.
        }
    }

    // If no sub-command was specified or if it was not found, call the main command's entry point.
    ktx::Tools cmd;
    return cmd.main(argc, argv);
}